

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuFloatFormat.cpp
# Opt level: O2

FloatFormat * tcu::FloatFormat::nativeFloat(void)

{
  FloatFormat *in_RDI;
  
  FloatFormat(in_RDI,-0x7e,0x7f,0x17,true,YES,YES,YES);
  return in_RDI;
}

Assistant:

FloatFormat	FloatFormat::nativeFloat (void)
{
	return nativeFormat<float>();
}